

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

ostream * Imath_3_2::operator<<(ostream *s,Vec2<float> *v)

{
  ostream *poVar1;
  float *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,'(');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1,')');
  return poVar1;
}

Assistant:

std::ostream&
operator<< (std::ostream& s, const Vec2<T>& v)
{
    return s << '(' << v.x << ' ' << v.y << ')';
}